

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QDockWidget_*>::begin(QList<QDockWidget_*> *this)

{
  QDockWidget **n;
  QArrayDataPointer<QDockWidget_*> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QDockWidget_*> *)0x6092d9);
  QArrayDataPointer<QDockWidget_*>::operator->(in_RDI);
  n = QArrayDataPointer<QDockWidget_*>::begin((QArrayDataPointer<QDockWidget_*> *)0x6092ea);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }